

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jkGetF0.cc
# Opt level: O1

int sptk::snack::init_dp_f0(double freq,F0_params *par,long *buffsize,long *sdstep,Buffer *buffer)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  frame_rec *pfVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  Frame *pFVar13;
  int *piVar14;
  float *pfVar15;
  Windstat *pWVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  int iVar24;
  double dVar22;
  undefined1 auVar23 [16];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  int iVar32;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  uVar3 = par->trans_spec;
  fVar25 = par->double_cost;
  fVar11 = par->trans_cost;
  fVar12 = par->trans_amp;
  buffer->vbias = par->voice_bias;
  buffer->fdouble = fVar25;
  fVar25 = par->frame_step;
  buffer->tcost = fVar11;
  buffer->tfact_a = fVar12;
  buffer->tfact_s = (float)uVar3;
  buffer->frame_int = fVar25;
  dVar22 = (double)fVar25 * freq;
  dVar7 = (double)par->wind_dur * freq;
  uVar19 = -(ulong)(dVar22 < 0.0);
  uVar20 = -(ulong)(dVar7 < 0.0);
  auVar29._0_8_ = ~uVar19 & 0x3fe0000000000000;
  auVar29._8_8_ = ~uVar20 & 0x3fe0000000000000;
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar19 & 0xbfe0000000000000;
  auVar9._12_4_ = (uint)(uVar20 >> 0x20) & 0xbfe00000;
  iVar28 = (int)(SUB168(auVar29 | auVar9,0) + dVar22);
  iVar32 = (int)(SUB168(auVar29 | auVar9,8) + dVar7);
  buffer->step = iVar28;
  buffer->size = iVar32;
  fVar25 = (float)((double)iVar28 / freq);
  buffer->frame_int = fVar25;
  buffer->wdur = (float)((double)iVar32 / freq);
  uVar1 = par->min_f0;
  uVar4 = par->max_f0;
  auVar30._8_8_ = freq;
  auVar30._0_8_ = freq;
  auVar10._8_4_ = SUB84((double)(float)uVar4,0);
  auVar10._0_8_ = (double)(float)uVar1;
  auVar10._12_4_ = (int)((ulong)(double)(float)uVar4 >> 0x20);
  auVar31 = divpd(auVar30,auVar10);
  uVar19 = -(ulong)(auVar31._8_8_ < 0.0);
  uVar20 = -(ulong)(auVar31._0_8_ < 0.0);
  auVar23._0_8_ = ~uVar19 & 0x3fe0000000000000;
  auVar23._8_8_ = ~uVar20 & 0x3fe0000000000000;
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar19 & 0xbfe0000000000000;
  auVar8._12_4_ = (uint)(uVar20 >> 0x20) & 0xbfe00000;
  iVar21 = (int)(SUB168(auVar23 | auVar8,0) + auVar31._8_8_);
  iVar24 = (int)(SUB168(auVar23 | auVar8,8) + auVar31._0_8_);
  buffer->start = iVar21;
  buffer->stop = iVar24;
  iVar18 = (iVar24 - iVar21) + 1;
  buffer->nlags = iVar18;
  iVar32 = iVar24 + iVar32 + 1;
  buffer->ncomp = iVar32;
  buffer->maxpeaks = (short)(((iVar24 - iVar21) - (iVar18 >> 0x1f)) + 1U >> 1) + 2;
  buffer->ln2 = 0.6931472;
  dVar22 = (double)fVar25;
  auVar26._8_8_ = dVar22;
  auVar26._0_8_ = dVar22;
  auVar31 = divpd(_DAT_0012c5e0,auVar26);
  buffer->size_frame_hist = (int)auVar31._0_8_;
  buffer->size_frame_out = (int)auVar31._8_8_;
  uVar2 = par->lag_weight;
  uVar5 = par->freq_weight;
  auVar27._4_4_ = uVar2;
  auVar27._0_4_ = uVar5;
  auVar27._8_8_ = 0;
  auVar31._4_4_ = (float)iVar24;
  auVar31._0_4_ = fVar25;
  auVar31._8_4_ = (int)((ulong)((double)iVar28 / freq) >> 0x20);
  auVar31._12_4_ = (float)iVar24;
  auVar31 = divps(auVar27,auVar31);
  buffer->freqwt = (float)(int)auVar31._0_8_;
  buffer->lagwt = (float)(int)((ulong)auVar31._0_8_ >> 0x20);
  if (iVar32 < iVar28) {
    iVar21 = (int)(freq * 0.2) / iVar28;
  }
  else {
    iVar21 = ((int)(freq * 0.2) - iVar32) / iVar28 + 1;
  }
  iVar24 = ((int)(freq * 0.02) - (int)(freq * 0.03)) / 2 + (int)(freq * 0.03);
  if (iVar24 <= iVar32) {
    iVar24 = iVar32;
  }
  iVar24 = iVar24 + (((int)(freq * 0.005) - ((int)(freq * 0.005) + 1 >> 0x1f)) + 1 >> 1);
  buffer->pad = iVar24;
  *buffsize = (long)(iVar24 + iVar21 * iVar28);
  *sdstep = (long)(iVar21 * iVar28);
  buffer->size_cir_buffer = (int)(1.5 / dVar22);
  pFVar13 = alloc_frame(iVar18,par->n_cands);
  buffer->tailF = pFVar13;
  buffer->headF = pFVar13;
  if (1 < buffer->size_cir_buffer) {
    iVar18 = 1;
    do {
      pFVar13 = alloc_frame(buffer->nlags,par->n_cands);
      pfVar6 = buffer->headF;
      pfVar6->next = pFVar13;
      pFVar13->prev = pfVar6;
      buffer->headF = pFVar13;
      iVar18 = iVar18 + 1;
    } while (iVar18 < buffer->size_cir_buffer);
  }
  pFVar13 = buffer->headF;
  pfVar6 = buffer->tailF;
  pFVar13->next = pfVar6;
  pfVar6->prev = pFVar13;
  buffer->headF = pfVar6;
  if (buffer->pcands == (int *)0x0) {
    piVar14 = (int *)ckalloc((long)par->n_cands << 2);
    buffer->pcands = piVar14;
  }
  buffer->output_buf_size = buffer->size_cir_buffer;
  pfVar15 = (float *)ckalloc((long)buffer->size_cir_buffer << 2);
  buffer->rms_speech = pfVar15;
  pfVar15 = (float *)ckalloc((long)buffer->output_buf_size << 2);
  buffer->f0p = pfVar15;
  pfVar15 = (float *)ckalloc((long)buffer->output_buf_size << 2);
  buffer->vuvp = pfVar15;
  pfVar15 = (float *)ckalloc((long)buffer->output_buf_size << 2);
  buffer->acpkp = pfVar15;
  pfVar15 = (float *)ckalloc((long)buffer->maxpeaks << 2);
  buffer->peaks = pfVar15;
  piVar14 = (int *)ckalloc((long)buffer->maxpeaks << 2);
  buffer->locs = piVar14;
  iVar18 = (int)(freq * 0.02) / buffer->step;
  buffer->wReuse = iVar18;
  if (iVar18 != 0) {
    pWVar16 = (Windstat *)ckalloc((long)iVar18 * 0x19c);
    buffer->windstat = pWVar16;
    iVar18 = buffer->wReuse;
    if (0 < (long)iVar18) {
      lVar17 = 0;
      do {
        *(undefined8 *)((long)&pWVar16->err + lVar17) = 0;
        lVar17 = lVar17 + 0x19c;
      } while ((long)iVar18 * 0x19c - lVar17 != 0);
    }
  }
  if (debug_level != 0) {
    init_dp_f0();
  }
  buffer->num_active_frames = 0;
  buffer->first_time = 1;
  return 0;
}

Assistant:

init_dp_f0(double freq, F0_params *par, long *buffsize, long *sdstep, Buffer *buffer)
{
  int nframes;
  int i;
  int stat_wsize, agap, ind, downpatch;
/*
 * reassigning some constants 
 */

  buffer->tcost = par->trans_cost;
  buffer->tfact_a = par->trans_amp;
  buffer->tfact_s = par->trans_spec;
  buffer->vbias = par->voice_bias;
  buffer->fdouble = par->double_cost;
  buffer->frame_int = par->frame_step;
  
  buffer->step = eround(buffer->frame_int * freq);
  buffer->size = eround(par->wind_dur * freq);
  buffer->frame_int = (float)(((float)buffer->step)/freq);
  buffer->wdur = (float)(((float)buffer->size)/freq);
  buffer->start = eround(freq / par->max_f0);
  buffer->stop = eround(freq / par->min_f0);
  buffer->nlags = buffer->stop - buffer->start + 1;
  buffer->ncomp = buffer->size + buffer->stop + 1; /* # of samples required by xcorr
			      comp. per fr. */
  buffer->maxpeaks = 2 + (buffer->nlags/2);	/* maximum number of "peaks" findable in ccf */
  buffer->ln2 = (float)log(2.0);
  buffer->size_frame_hist = (int) (DP_HIST / buffer->frame_int);
  buffer->size_frame_out = (int) (DP_LIMIT / buffer->frame_int);

/*
 * SET UP THE D.P. WEIGHTING FACTORS:
 *      The intent is to make the effectiveness of the various fudge factors
 *      independent of frame rate or sampling frequency.                
 */
  
  /* Lag-dependent weighting factor to emphasize early peaks (higher freqs)*/
  buffer->lagwt = par->lag_weight/buffer->stop;
  
  /* Penalty for a frequency skip in F0 per frame */
  buffer->freqwt = par->freq_weight/buffer->frame_int;
  
  i = (int) (READ_SIZE *freq);
  if(buffer->ncomp >= buffer->step) nframes = ((i-buffer->ncomp)/buffer->step ) + 1;
  else nframes = i / buffer->step;

  /* *buffsize is the number of samples needed to make F0 computation
     of nframes DP frames possible.  The last DP frame is patched with
     enough points so that F0 computation on it can be carried.  F0
     computaion on each frame needs enough points to do

     1) xcross or cross correlation measure:
           enough points to do xcross - ncomp

     2) stationarity measure:
           enough to make 30 msec windowing possible - ind

     3) downsampling:
           enough to make filtering possible -- downpatch
 
     So there are nframes whole DP frames, padded with pad points
     to make the last frame F0 computation ok.

  */

  /* last point in data frame needs points of 1/2 downsampler filter length 
     long, 0.005 is the filter length used in downsampler */
  downpatch = (((int) (freq * 0.005))+1) / 2;

  stat_wsize = (int) (STAT_WSIZE * freq);
  agap = (int) (STAT_AINT * freq);
  ind = ( agap - stat_wsize ) / 2;
  i = stat_wsize + ind;
  buffer->pad = downpatch + ((i>buffer->ncomp) ? i:buffer->ncomp);
  *buffsize = nframes * buffer->step + buffer->pad;
  *sdstep = nframes * buffer->step;
  
  /* Allocate space for the DP storage circularly linked data structure */

  buffer->size_cir_buffer = (int) (DP_CIRCULAR / buffer->frame_int);

  /* creating circularly linked data structures */
  buffer->tailF = alloc_frame(buffer->nlags, par->n_cands);
  buffer->headF = buffer->tailF;

  /* link them up */
  for(i=1; i<buffer->size_cir_buffer; i++){
    buffer->headF->next = alloc_frame(buffer->nlags, par->n_cands);
    buffer->headF->next->prev = buffer->headF;
    buffer->headF = buffer->headF->next;
  }
  buffer->headF->next = buffer->tailF;
  buffer->tailF->prev = buffer->headF;

  buffer->headF = buffer->tailF;

  /* Allocate sscratch array to use during backtrack convergence test. */
  if( ! buffer->pcands ) {
    buffer->pcands = (int *) ckalloc( par->n_cands * sizeof(int));
    /*    spsassert(pcands,"can't allocate pathcands");*/
  }

  /* Allocate arrays to return F0 and related signals. */

  /* Note: remember to compare *vecsize with size_frame_out, because
     size_cir_buffer is not constant */
  buffer->output_buf_size = buffer->size_cir_buffer;
  buffer->rms_speech = (float*)ckalloc(sizeof(float) * buffer->output_buf_size);
  /*  spsassert(rms_speech,"rms_speech ckalloc failed");*/
  buffer->f0p = (float*)ckalloc(sizeof(float) * buffer->output_buf_size);
  /*  spsassert(f0p,"f0p ckalloc failed");*/
  buffer->vuvp = (float*)ckalloc(sizeof(float)* buffer->output_buf_size);
  /*  spsassert(vuvp,"vuvp ckalloc failed");*/
  buffer->acpkp = (float*)ckalloc(sizeof(float) * buffer->output_buf_size);
  /*  spsassert(acpkp,"acpkp ckalloc failed");*/

  /* Allocate space for peak location and amplitude scratch arrays. */
  buffer->peaks = (float*)ckalloc(sizeof(float) * buffer->maxpeaks);
  /*  spsassert(peaks,"peaks ckalloc failed");*/
  buffer->locs = (int*)ckalloc(sizeof(int) * buffer->maxpeaks);
  /*  spsassert(locs, "locs ckalloc failed");*/
  
  /* Initialise the retrieval/saving scheme of window statistic measures */
  buffer->wReuse = agap / buffer->step;
  if (buffer->wReuse){
      buffer->windstat = (Windstat *) ckalloc( buffer->wReuse * sizeof(Windstat));
      /*      spsassert(windstat, "windstat ckalloc failed");*/
      for(i=0; i<buffer->wReuse; i++){
	  buffer->windstat[i].err = 0;
	  buffer->windstat[i].rms = 0;
      }
  }

  if(debug_level){
    Fprintf(stderr, "done with initialization:\n");
    Fprintf(stderr,
	    " size_cir_buffer:%d  xcorr frame size:%d start lag:%d nlags:%d\n",
	    buffer->size_cir_buffer, buffer->size, buffer->start, buffer->nlags);
  }

  buffer->num_active_frames = 0;
  buffer->first_time = 1;

  return(0);
}